

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O3

void __thiscall Node::ScanVarList(Node *this,VARTYPE ThisType,VARCLASS ThisClass,int Status)

{
  pointer pcVar1;
  VARTYPE newType;
  VariableStruct *pVVar2;
  int iVar3;
  VARCLASS ThisClass_00;
  Node *pNVar4;
  VariableStruct local_188;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  do {
    for (; iVar3 = this->Type, 0x1d8 < iVar3; this = this->Tree[0]) {
      if (iVar3 - 500U < 2) {
        if (this->Tree[0] != (Node *)0x0) {
          ScanVarList(this->Tree[0],ThisType,ThisClass,Status);
        }
        this = this->Tree[1];
        goto LAB_00109e43;
      }
      if (iVar3 != 0x1f2) {
        if (iVar3 != 0x1d9) {
          return;
        }
        if (this->Tree[1] == (Node *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Scanning: Type = NULL in BAS_V_DEFINEFUN",0x28);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
          newType = VARTYPE_NONE;
        }
        else {
          newType = ScanType(this->Tree[1]);
        }
        if (this->Tree[0] != (Node *)0x0) {
          pVVar2 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
          if (pVVar2 == (VariableStruct *)0x0) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar1 = (this->Tree[0]->TextValue)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar1,
                       pcVar1 + (this->Tree[0]->TextValue)._M_string_length);
            VariableStruct::VariableStruct(&local_188,&local_f0,newType,VARCLASS_FUNC,Status,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            VariableList::Append(Variables,&local_188,1);
            if (local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_188.ParList.
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_188.ParList.
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188.Prefix._M_dataplus._M_p != &local_188.Prefix.field_2) {
              operator_delete(local_188.Prefix._M_dataplus._M_p,
                              local_188.Prefix.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188.CName._M_dataplus._M_p != &local_188.CName.field_2) {
              operator_delete(local_188.CName._M_dataplus._M_p,
                              local_188.CName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188.BasicName._M_dataplus._M_p != &local_188.BasicName.field_2) {
              operator_delete(local_188.BasicName._M_dataplus._M_p,
                              local_188.BasicName.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            pVVar2->Class = VARCLASS_FUNC;
            pVVar2->Type = newType;
          }
        }
        pNVar4 = this->Tree[2];
        if (pNVar4 == (Node *)0x0) goto LAB_0010a45a;
        ThisClass_00 = VARCLASS_NONE;
        iVar3 = 1;
        goto LAB_0010a455;
      }
LAB_00109e58:
    }
    if (iVar3 < 0x10f) {
      if (iVar3 != 0x3d) {
        return;
      }
      goto LAB_00109e58;
    }
    if (0x1d2 < iVar3) {
      if (iVar3 == 0x1d3) {
        pVVar2 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
        if (pVVar2 != (VariableStruct *)0x0) {
          return;
        }
        if (ThisType == VARTYPE_NONE) {
          pcVar1 = (this->TextValue)._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar1,pcVar1 + (this->TextValue)._M_string_length);
          ThisType = GuessVarType(&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar1 = (this->TextValue)._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + (this->TextValue)._M_string_length);
        VariableStruct::VariableStruct(&local_188,&local_b0,ThisType,ThisClass,Status,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        VariableList::Append(Variables,&local_188,0);
        if (local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_188.ParList.
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_188.ParList.
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.Prefix._M_dataplus._M_p != &local_188.Prefix.field_2) {
          operator_delete(local_188.Prefix._M_dataplus._M_p,
                          local_188.Prefix.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.CName._M_dataplus._M_p != &local_188.CName.field_2) {
          operator_delete(local_188.CName._M_dataplus._M_p,
                          local_188.CName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.BasicName._M_dataplus._M_p == &local_188.BasicName.field_2) {
          return;
        }
        operator_delete(local_188.BasicName._M_dataplus._M_p,
                        local_188.BasicName.field_2._M_allocated_capacity + 1);
        return;
      }
      if (iVar3 != 0x1d8) {
        return;
      }
      newType = ScanType(this->Tree[1]);
      if (this->Tree[0] != (Node *)0x0) {
        pVVar2 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
        if (pVVar2 == (VariableStruct *)0x0) {
          pNVar4 = this->Tree[2];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar1 = (this->Tree[0]->TextValue)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar1,pcVar1 + (this->Tree[0]->TextValue)._M_string_length
                    );
          VariableStruct::VariableStruct
                    (&local_188,&local_d0,newType,(uint)(pNVar4 != (Node *)0x0),Status,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          VariableList::Append(Variables,&local_188,0);
          if (local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.ParList.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.ParList.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.Prefix._M_dataplus._M_p != &local_188.Prefix.field_2) {
            operator_delete(local_188.Prefix._M_dataplus._M_p,
                            local_188.Prefix.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.CName._M_dataplus._M_p != &local_188.CName.field_2) {
            operator_delete(local_188.CName._M_dataplus._M_p,
                            local_188.CName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.BasicName._M_dataplus._M_p != &local_188.BasicName.field_2) {
            operator_delete(local_188.BasicName._M_dataplus._M_p,
                            local_188.BasicName.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pVVar2->Class = VARCLASS_NONE;
          pVVar2->Type = newType;
        }
      }
      pNVar4 = this->Tree[2];
      ThisClass_00 = ThisClass;
      iVar3 = Status;
      if (pNVar4 == (Node *)0x0) goto LAB_0010a45a;
LAB_0010a455:
      ScanVarList(pNVar4,newType,ThisClass_00,iVar3);
LAB_0010a45a:
      if (this->Block[0] == (Node *)0x0) {
        return;
      }
      ScanVarList(this->Block[0],newType,ThisClass,Status);
      return;
    }
    if (iVar3 != 0x10f) {
      if (iVar3 != 0x1cd) {
        return;
      }
      pVVar2 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
      if (pVVar2 == (VariableStruct *)0x0) {
        if (ThisType == VARTYPE_NONE) {
          pcVar1 = (this->TextValue)._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,pcVar1 + (this->TextValue)._M_string_length);
          ThisType = GuessVarType(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar1 = (this->TextValue)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + (this->TextValue)._M_string_length);
        VariableStruct::VariableStruct(&local_188,&local_70,ThisType,ThisClass,Status,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        VariableList::Append(Variables,&local_188,0);
        if (local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_188.ParList.
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_188.ParList.
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.Prefix._M_dataplus._M_p != &local_188.Prefix.field_2) {
          operator_delete(local_188.Prefix._M_dataplus._M_p,
                          local_188.Prefix.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.CName._M_dataplus._M_p != &local_188.CName.field_2) {
          operator_delete(local_188.CName._M_dataplus._M_p,
                          local_188.CName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.BasicName._M_dataplus._M_p != &local_188.BasicName.field_2) {
          operator_delete(local_188.BasicName._M_dataplus._M_p,
                          local_188.BasicName.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->Tree[0] == (Node *)0x0) {
        return;
      }
      VariableScanOne(this->Tree[0],0);
      return;
    }
    this = this->Tree[0];
    Status = 0;
LAB_00109e43:
    if (this == (Node *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Node::ScanVarList(
	VARTYPE ThisType,	/**< This type */
	VARCLASS ThisClass,	/**< This class */
	int Status		/**< This status */
)
{
	VariableStruct* ThisVar;

	switch(Type)
	{
	case BAS_N_LIST:
	case BAS_N_ASSIGNLIST:

		if (Tree[0] != 0)
		{
			Tree[0]->ScanVarList(ThisType, ThisClass, Status);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->ScanVarList(ThisType, ThisClass, Status);
		}
		break;

	case '=':
	case BAS_N_ASSIGN:

		Tree[0]->ScanVarList(ThisType, ThisClass, Status);
		break;

	case BAS_V_DEFINEVAR:

		ThisType = Tree[1]->ScanType();

		if (Tree[0] != 0)
		{
			ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);
			if (ThisVar == 0)
			{
				VARCLASS ThisClass = VARCLASS_NONE;
				if (Tree[2] != 0)
				{
					ThisClass = VARCLASS_ARRAY;
				}

				//
				// Create variable
				//
				VariableStruct NewVar(Tree[0]->TextValue,
					ThisType, ThisClass, Status);

				//
				// Add to variable table
				//
				Variables->Append(NewVar, false);
			}
			else
			{
				ThisVar->Class =VARCLASS_NONE;
				ThisVar->Type = ThisType;
			}
		}

		if (Tree[2] != NULL)
		{
			Tree[2]->ScanVarList(ThisType, ThisClass, Status);
		}

		if (Block[0] != NULL)
		{
			Block[0]->ScanVarList(ThisType, ThisClass, Status);
		}

		break;

	case BAS_V_DEFINEFUN:

		if (Tree[1] != 0)
		{
			ThisType = Tree[1]->ScanType();
		}
		else
		{
			std::cerr << "Scanning: Type = NULL in BAS_V_DEFINEFUN" << std::endl;
			ThisType = VARTYPE_NONE;
		}
		if (Tree[0] != 0)
		{
			ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);
			if (ThisVar == 0)
			{
				//
				// Create variable
				//
				VariableStruct NewVar(Tree[0]->TextValue,
					ThisType, VARCLASS_FUNC, Status);

				//
				// Add to variable table
				//
				Variables->Append(NewVar, true);
			}
			else
			{
				ThisVar->Class = VARCLASS_FUNC;
				ThisVar->Type = ThisType;
			}
		}

		if (Tree[2] != NULL)
		{
			Tree[2]->ScanVarList(ThisType, VARCLASS_NONE, true);
		}

		if (Block[0] != NULL)
		{
			Block[0]->ScanVarList(ThisType, ThisClass, Status);
		}

		break;

	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
	case BAS_V_INT:
		// Ignore various numeric constants
		break;

	case BAS_V_FUNCTION:
		ThisVar = Variables->Lookup(TextValue, Tree[0]);
		if (ThisVar == 0)
		{
			VARTYPE FinalType = ThisType;
			if (FinalType == VARTYPE_NONE)
			{
				FinalType = GuessVarType(TextValue);
			}
			VariableStruct NewVar(TextValue,
				FinalType, ThisClass, Status);
			Variables->Append(NewVar);
		}
		if (Tree[0] != NULL)
		{
			Tree[0]->VariableScanOne(false);
		}
		break;

	case BAS_S_BY:
		if (Tree[0] != NULL)
		{
			Tree[0]->ScanVarList(ThisType, ThisClass, false);
		}
		break;

	case BAS_V_NAME:
		ThisVar = Variables->Lookup(TextValue, Tree[0]);
		if (ThisVar == 0)
		{
			VARTYPE FinalType = ThisType;
			if (FinalType == VARTYPE_NONE)
			{
				FinalType = GuessVarType(TextValue);
			}
			VariableStruct NewVar(TextValue,
				FinalType, ThisClass, Status);
			Variables->Append(NewVar);
		}
		break;
	}
}